

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5e4c5e::FunctionEncoding::printRight(FunctionEncoding *this,OutputStream *S)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  NodeArray::printWithComma(&this->Params,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar1 = this->Ret;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  if ((this->CVQuals & QualConst) != QualNone) {
    OutputStream::grow(S,6);
    builtin_strncpy(S->Buffer + S->CurrentPosition," const",6);
    S->CurrentPosition = S->CurrentPosition + 6;
  }
  if ((this->CVQuals & QualVolatile) != QualNone) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," volatile",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  if ((this->CVQuals & QualRestrict) != QualNone) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," restrict",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  if (this->RefQual == FrefQualRValue) {
    lVar4 = 3;
    OutputStream::grow(S,3);
    pcVar2 = S->Buffer;
    sVar3 = S->CurrentPosition;
    pcVar2[sVar3 + 2] = '&';
  }
  else {
    if (this->RefQual != FrefQualLValue) goto LAB_001e0a5e;
    lVar4 = 2;
    OutputStream::grow(S,2);
    pcVar2 = S->Buffer;
    sVar3 = S->CurrentPosition;
  }
  (pcVar2 + sVar3)[0] = ' ';
  (pcVar2 + sVar3)[1] = '&';
  S->CurrentPosition = S->CurrentPosition + lVar4;
LAB_001e0a5e:
  pNVar1 = this->Attrs;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    if (pNVar1->RHSComponentCache != No) {
      (*pNVar1->_vptr_Node[5])(pNVar1,S);
      return;
    }
  }
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    S += "(";
    Params.printWithComma(S);
    S += ")";
    if (Ret)
      Ret->printRight(S);

    if (CVQuals & QualConst)
      S += " const";
    if (CVQuals & QualVolatile)
      S += " volatile";
    if (CVQuals & QualRestrict)
      S += " restrict";

    if (RefQual == FrefQualLValue)
      S += " &";
    else if (RefQual == FrefQualRValue)
      S += " &&";

    if (Attrs != nullptr)
      Attrs->print(S);
  }